

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::command<char_const(&)[13]>(parameter *__return_storage_ptr__,clipp *this,char (*flag) [13])

{
  parameter *ppVar1;
  allocator local_139;
  arg_string local_138;
  parameter local_118;
  clipp *local_18;
  char (*flag_local) [13];
  
  local_18 = this;
  flag_local = (char (*) [13])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,(char *)this,&local_139);
  parameter::parameter<>(&local_118,&local_138);
  ppVar1 = parameter::required(&local_118,true);
  ppVar1 = detail::token<clipp::parameter>::blocking(&ppVar1->super_token<clipp::parameter>,true);
  ppVar1 = detail::token<clipp::parameter>::repeatable(&ppVar1->super_token<clipp::parameter>,false)
  ;
  parameter::parameter(__return_storage_ptr__,ppVar1);
  parameter::~parameter(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
command(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(true).blocking(true).repeatable(false);
}